

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGIT.cxx
# Opt level: O3

void __thiscall cmCTestGIT::CommitParser::DoHeaderLine(CommitParser *this)

{
  int iVar1;
  string *this_00;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  basic_string_view<char,_std::char_traits<char>_> __str_01;
  Person committer;
  Person local_90;
  string local_40;
  
  local_90.Name._M_string_length =
       (size_type)(this->super_DiffParser).super_LineParser.Line._M_dataplus._M_p;
  local_90.Name._M_dataplus._M_p =
       (pointer)(this->super_DiffParser).super_LineParser.Line._M_string_length;
  __str._M_str = "commit ";
  __str._M_len = 7;
  iVar1 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                    ((basic_string_view<char,_std::char_traits<char>_> *)&local_90,0,7,__str);
  if (iVar1 == 0) {
    std::__cxx11::string::substr
              ((ulong)&local_90,(ulong)&(this->super_DiffParser).super_LineParser.Line);
    std::__cxx11::string::operator=((string *)&this->Rev,(string *)&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90.Name._M_dataplus._M_p == &local_90.Name.field_2) {
      return;
    }
  }
  else {
    local_90.Name._M_string_length =
         (size_type)(this->super_DiffParser).super_LineParser.Line._M_dataplus._M_p;
    local_90.Name._M_dataplus._M_p =
         (pointer)(this->super_DiffParser).super_LineParser.Line._M_string_length;
    __str_00._M_str = "author ";
    __str_00._M_len = 7;
    iVar1 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                      ((basic_string_view<char,_std::char_traits<char>_> *)&local_90,0,7,__str_00);
    if (iVar1 == 0) {
      local_90.Name._M_dataplus._M_p = (pointer)&local_90.Name.field_2;
      local_90.Name._M_string_length = 0;
      local_90.Name.field_2._M_local_buf[0] = '\0';
      local_90.EMail._M_dataplus._M_p = (pointer)&local_90.EMail.field_2;
      local_90.EMail._M_string_length = 0;
      local_90.EMail.field_2._M_local_buf[0] = '\0';
      local_90.Time = 0;
      local_90.TimeZone = 0;
      ParsePerson(this,(this->super_DiffParser).super_LineParser.Line._M_dataplus._M_p + 7,&local_90
                 );
      std::__cxx11::string::_M_assign((string *)&(this->Rev).Author);
      std::__cxx11::string::_M_assign((string *)&(this->Rev).EMail);
      FormatDateTime_abi_cxx11_(&local_40,this,&local_90);
      this_00 = (string *)&(this->Rev).Date;
    }
    else {
      local_90.Name._M_string_length =
           (size_type)(this->super_DiffParser).super_LineParser.Line._M_dataplus._M_p;
      local_90.Name._M_dataplus._M_p =
           (pointer)(this->super_DiffParser).super_LineParser.Line._M_string_length;
      __str_01._M_str = "committer ";
      __str_01._M_len = 10;
      iVar1 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                        ((basic_string_view<char,_std::char_traits<char>_> *)&local_90,0,10,__str_01
                        );
      if (iVar1 != 0) {
        return;
      }
      local_90.Name._M_dataplus._M_p = (pointer)&local_90.Name.field_2;
      local_90.Name._M_string_length = 0;
      local_90.Name.field_2._M_local_buf[0] = '\0';
      local_90.EMail._M_dataplus._M_p = (pointer)&local_90.EMail.field_2;
      local_90.EMail._M_string_length = 0;
      local_90.EMail.field_2._M_local_buf[0] = '\0';
      local_90.Time = 0;
      local_90.TimeZone = 0;
      ParsePerson(this,(this->super_DiffParser).super_LineParser.Line._M_dataplus._M_p + 10,
                  &local_90);
      std::__cxx11::string::_M_assign((string *)&(this->Rev).Committer);
      std::__cxx11::string::_M_assign((string *)&(this->Rev).CommitterEMail);
      FormatDateTime_abi_cxx11_(&local_40,this,&local_90);
      this_00 = (string *)&(this->Rev).CommitDate;
    }
    std::__cxx11::string::operator=(this_00,(string *)&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90.EMail._M_dataplus._M_p != &local_90.EMail.field_2) {
      operator_delete(local_90.EMail._M_dataplus._M_p,
                      CONCAT71(local_90.EMail.field_2._M_allocated_capacity._1_7_,
                               local_90.EMail.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90.Name._M_dataplus._M_p == &local_90.Name.field_2) {
      return;
    }
  }
  operator_delete(local_90.Name._M_dataplus._M_p,
                  CONCAT71(local_90.Name.field_2._M_allocated_capacity._1_7_,
                           local_90.Name.field_2._M_local_buf[0]) + 1);
  return;
}

Assistant:

void DoHeaderLine()
  {
    // Look for header fields that we need.
    if (cmHasLiteralPrefix(this->Line, "commit ")) {
      this->Rev.Rev = this->Line.substr(7);
    } else if (cmHasLiteralPrefix(this->Line, "author ")) {
      Person author;
      this->ParsePerson(this->Line.c_str() + 7, author);
      this->Rev.Author = author.Name;
      this->Rev.EMail = author.EMail;
      this->Rev.Date = this->FormatDateTime(author);
    } else if (cmHasLiteralPrefix(this->Line, "committer ")) {
      Person committer;
      this->ParsePerson(this->Line.c_str() + 10, committer);
      this->Rev.Committer = committer.Name;
      this->Rev.CommitterEMail = committer.EMail;
      this->Rev.CommitDate = this->FormatDateTime(committer);
    }
  }